

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTestsNamesOnly(Config *config)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestSpec *this;
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this_00;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_00;
  pointer this_01;
  TestCaseInfo *pTVar4;
  ostream *poVar5;
  ostream *this_02;
  TestCaseInfo *testCaseInfo;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_120;
  const_iterator itEnd;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_110;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  size_t matchedTests;
  string local_e0 [32];
  TestSpecParser local_c0;
  TestSpec local_50;
  undefined1 local_28 [8];
  TestSpec testSpec;
  Config *config_local;
  
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)local_28,(TestSpec *)CONCAT44(extraout_var,iVar2));
  this = (TestSpec *)
         (*(code *)((testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[0xd].m_p)();
  bVar1 = TestSpec::hasFilters(this);
  if (!bVar1) {
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser(&local_c0,tagAliases);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"*",(allocator *)((long)&matchedTests + 7));
    this_00 = TestSpecParser::parse(&local_c0,(string *)local_e0);
    TestSpecParser::testSpec(&local_50,this_00);
    TestSpec::operator=((TestSpec *)local_28,&local_50);
    TestSpec::~TestSpec(&local_50);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&matchedTests + 7));
    TestSpecParser::~TestSpecParser(&local_c0);
  }
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar2),local_28,
             testSpec.m_filters.
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,&it,0);
  itEnd._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_110,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&itEnd);
  testCaseInfo = (TestCaseInfo *)
                 std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_120,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&testCaseInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_110,&local_120);
    if (!bVar1) break;
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&((matchedTestCases.
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->super_TestCaseInfo).field_0x1;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator->(&local_110);
    pTVar4 = TestCase::getTestCaseInfo(this_01);
    poVar5 = cout();
    this_02 = std::operator<<((ostream *)poVar5,(string *)pTVar4);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_110);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  TestSpec::~TestSpec((TestSpec *)local_28);
  return (size_t)matchedTestCases.
                 super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Catch::cout() << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }